

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void __thiscall
tcu::Matrix<tcu::Interval,_2,_2>::Matrix
          (Matrix<tcu::Interval,_2,_2> *this,Matrix<tcu::Interval,_2,_2> *src)

{
  bool *pbVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double dVar4;
  Vector<tcu::Interval,_2> *pVVar5;
  Vector<tcu::Interval,_2> *pVVar6;
  undefined7 uVar7;
  bool bVar8;
  bool bVar9;
  long lVar10;
  undefined4 local_e;
  undefined3 uStack_a;
  undefined4 local_7;
  undefined3 uStack_3;
  
  lVar10 = 0x20;
  do {
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar10 + -0x20) = 0;
    puVar2 = (undefined8 *)((long)((this->m_data).m_data[0].m_data + -1) + lVar10);
    *puVar2 = 0x7ff0000000000000;
    puVar2[1] = 0xfff0000000000000;
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar10 + -8) = 0;
    pbVar1 = &(this->m_data).m_data[0].m_data[0].m_hasNaN + lVar10;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0x80);
  lVar10 = 0;
  bVar8 = true;
  do {
    bVar9 = bVar8;
    (this->m_data).m_data[lVar10].m_data[0].m_hasNaN = false;
    *(undefined4 *)&(this->m_data).m_data[lVar10].m_data[0].field_0x1 = local_7;
    *(uint *)&(this->m_data).m_data[lVar10].m_data[0].field_0x4 = CONCAT31(uStack_3,local_7._3_1_);
    pdVar3 = &(this->m_data).m_data[lVar10].m_data[0].m_lo;
    *pdVar3 = INFINITY;
    pdVar3[1] = -INFINITY;
    (this->m_data).m_data[lVar10].m_data[1].m_hasNaN = false;
    *(undefined4 *)&(this->m_data).m_data[lVar10].m_data[1].field_0x1 = local_e;
    *(uint *)&(this->m_data).m_data[lVar10].m_data[1].field_0x4 = CONCAT31(uStack_a,local_e._3_1_);
    pdVar3 = &(this->m_data).m_data[lVar10].m_data[1].m_lo;
    *pdVar3 = INFINITY;
    pdVar3[1] = -INFINITY;
    lVar10 = 1;
    bVar8 = false;
  } while (bVar9);
  (this->m_data).m_data[0].m_data[0].m_hi = (src->m_data).m_data[0].m_data[0].m_hi;
  uVar7 = *(undefined7 *)&(src->m_data).m_data[0].m_data[0].field_0x1;
  dVar4 = (src->m_data).m_data[0].m_data[0].m_lo;
  (this->m_data).m_data[0].m_data[0].m_hasNaN = (src->m_data).m_data[0].m_data[0].m_hasNaN;
  *(undefined7 *)&(this->m_data).m_data[0].m_data[0].field_0x1 = uVar7;
  (this->m_data).m_data[0].m_data[0].m_lo = dVar4;
  (this->m_data).m_data[1].m_data[0].m_hi = (src->m_data).m_data[1].m_data[0].m_hi;
  uVar7 = *(undefined7 *)&(src->m_data).m_data[1].m_data[0].field_0x1;
  dVar4 = (src->m_data).m_data[1].m_data[0].m_lo;
  (this->m_data).m_data[1].m_data[0].m_hasNaN = (src->m_data).m_data[1].m_data[0].m_hasNaN;
  *(undefined7 *)&(this->m_data).m_data[1].m_data[0].field_0x1 = uVar7;
  (this->m_data).m_data[1].m_data[0].m_lo = dVar4;
  uVar7 = *(undefined7 *)&(src->m_data).m_data[0].m_data[1].field_0x1;
  dVar4 = (src->m_data).m_data[0].m_data[1].m_lo;
  (this->m_data).m_data[0].m_data[1].m_hasNaN = (src->m_data).m_data[0].m_data[1].m_hasNaN;
  *(undefined7 *)&(this->m_data).m_data[0].m_data[1].field_0x1 = uVar7;
  (this->m_data).m_data[0].m_data[1].m_lo = dVar4;
  (this->m_data).m_data[0].m_data[1].m_hi = (src->m_data).m_data[0].m_data[1].m_hi;
  pVVar5 = (src->m_data).m_data;
  uVar7 = *(undefined7 *)&pVVar5[1].m_data[1].field_0x1;
  dVar4 = (src->m_data).m_data[1].m_data[1].m_lo;
  pVVar6 = (this->m_data).m_data;
  pVVar6[1].m_data[1].m_hasNaN = pVVar5[1].m_data[1].m_hasNaN;
  *(undefined7 *)&pVVar6[1].m_data[1].field_0x1 = uVar7;
  (this->m_data).m_data[1].m_data[1].m_lo = dVar4;
  (this->m_data).m_data[1].m_data[1].m_hi = (src->m_data).m_data[1].m_data[1].m_hi;
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Matrix<T, Rows, Cols>& src)
{
	*this = src;
}